

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
* __thiscall
pbrt::
Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
::operator=(Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
            *this,Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                  *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  Tuple2<pbrt::Point2,_int> TVar7;
  Tuple2<pbrt::Point2,_int> TVar8;
  Tuple2<pbrt::Point2,_int> TVar9;
  int iVar10;
  undefined4 extraout_var;
  int iVar11;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
  *pvVar12;
  memory_resource *pmVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Bounds2<int> tmp;
  
  pmVar13 = (this->allocator).memoryResource;
  if (pmVar13 == (other->allocator).memoryResource) {
    TVar7 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    TVar8 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    TVar9 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
         (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar9;
    (other->extent).pMin.super_Tuple2<pbrt::Point2,_int> = TVar7;
    (other->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar8;
    pvVar12 = this->values;
    this->values = other->values;
    other->values = pvVar12;
  }
  else {
    iVar10 = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar1 = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    iVar2 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar3 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    if (iVar1 == iVar3 && iVar10 == iVar2) {
      iVar4 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x;
      iVar11 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y;
      iVar5 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y;
      iVar14 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x;
      if (iVar11 == iVar5 && iVar4 == iVar14) {
        uVar15 = (iVar5 - iVar1) * (iVar4 - iVar10);
        if (0 < (int)uVar15) {
          lVar16 = 0;
          do {
            pvVar12 = this->values;
            pvVar6 = *(void **)((long)&(pvVar12->
                                       super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + lVar16);
            if (pvVar6 != (void *)0x0) {
              operator_delete(pvVar6,*(long *)((long)&(pvVar12->
                                                                                                            
                                                  super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                                  )._M_impl.super__Vector_impl_data.
                                                  _M_end_of_storage + lVar16) - (long)pvVar6);
              pvVar12 = this->values;
            }
            std::
            vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
            ::vector((vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                      *)((long)&(pvVar12->
                                super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar16),
                     (vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                      *)((long)&(other->values->
                                super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar16));
            lVar16 = lVar16 + 0x18;
          } while ((ulong)uVar15 * 0x18 != lVar16);
        }
        TVar7 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
        (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
             (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
        (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar7;
        return this;
      }
    }
    else {
      iVar14 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x;
      iVar11 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y;
    }
    uVar15 = (iVar11 - iVar3) * (iVar14 - iVar2);
    if (0 < (int)uVar15) {
      lVar16 = 0;
      do {
        pvVar6 = *(void **)((long)&(this->values->
                                   super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar16);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,*(long *)((long)&(this->values->
                                                  super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                                  )._M_impl.super__Vector_impl_data.
                                                  _M_end_of_storage + lVar16) - (long)pvVar6);
        }
        lVar16 = lVar16 + 0x18;
      } while ((ulong)uVar15 * 0x18 != lVar16);
      pmVar13 = (this->allocator).memoryResource;
    }
    (*pmVar13->_vptr_memory_resource[3])(pmVar13,this->values,(long)(int)uVar15 * 0x18,8);
    pmVar13 = (this->allocator).memoryResource;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    auVar18 = vpsubd_avx(auVar17,auVar18);
    auVar17 = vpshufd_avx(auVar18,0x55);
    auVar17 = vpmulld_avx(auVar17,auVar18);
    uVar15 = auVar17._0_4_;
    iVar10 = (*pmVar13->_vptr_memory_resource[2])(pmVar13,(long)(int)uVar15 * 0x18,8);
    this->values = (vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                    *)CONCAT44(extraout_var,iVar10);
    if (0 < (int)uVar15) {
      lVar16 = 0;
      do {
        std::
        vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>::
        vector((vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                *)((long)&(this->values->
                          super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar16),
               (vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                *)((long)&(other->values->
                          super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar16));
        lVar16 = lVar16 + 0x18;
      } while ((ulong)uVar15 * 0x18 != lVar16);
    }
  }
  return this;
}

Assistant:

Array2D &operator=(Array2D &&other) {
        if (allocator == other.allocator) {
            pstd::swap(extent, other.extent);
            pstd::swap(values, other.values);
        } else if (extent == other.extent) {
            int n = extent.Area();
            for (int i = 0; i < n; ++i) {
                allocator.destroy(values + i);
                allocator.construct(values + i, other.values[i]);
            }
            extent = other.extent;
        } else {
            int n = extent.Area();
            for (int i = 0; i < n; ++i)
                allocator.destroy(values + i);
            allocator.deallocate_object(values, n);

            int no = other.extent.Area();
            values = allocator.allocate_object<T>(no);
            for (int i = 0; i < no; ++i)
                allocator.construct(values + i, other.values[i]);
        }
        return *this;
    }